

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

Value * __thiscall cmGlobalGenerator::GetJson(Value *__return_storage_ptr__,cmGlobalGenerator *this)

{
  int iVar1;
  Value *pVVar2;
  String local_60;
  Value local_40;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  (*this->_vptr_cmGlobalGenerator[3])(&local_60,this);
  Json::Value::Value(&local_40,&local_60);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar2,&local_40);
  Json::Value::~Value(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  iVar1 = (*this->_vptr_cmGlobalGenerator[0x26])(this);
  Json::Value::Value(&local_40,SUB41(iVar1,0));
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"multiConfig");
  Json::Value::operator=(pVVar2,&local_40);
  Json::Value::~Value(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmGlobalGenerator::GetJson() const
{
  Json::Value generator = Json::objectValue;
  generator["name"] = this->GetName();
  generator["multiConfig"] = this->IsMultiConfig();
  return generator;
}